

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSim.c
# Opt level: O1

void Ssc_GiaSimRound(Gia_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Vec_Wrd_t *pVVar5;
  Vec_Int_t *pVVar6;
  word *__s;
  int *piVar7;
  Gia_Obj_t *pGVar8;
  uint uVar9;
  word *pwVar10;
  int iVar11;
  word *pwVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  uint uVar21;
  
  uVar20 = (long)p->vSimsPi->nSize / (long)(p->vCis->nSize - p->nRegs);
  Ssc_GiaResetSimInfo(p);
  uVar1 = p->vSims->nSize;
  uVar2 = p->nObjs;
  iVar11 = (int)uVar20;
  if (iVar11 != (int)uVar1 / (int)uVar2) {
    __assert_fail("nWords == Vec_WrdSize(p->vSims) / Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssc/sscSim.c"
                  ,0xfd,"void Ssc_GiaSimRound(Gia_Man_t *)");
  }
  if (0 < (int)uVar1) {
    pVVar5 = p->vSimsPi;
    iVar3 = pVVar5->nSize;
    pVVar6 = p->vCis;
    uVar21 = pVVar6->nSize;
    iVar4 = p->nRegs;
    __s = p->vSims->pArray;
    uVar20 = uVar20 & 0xffffffff;
    if (0 < iVar11) {
      memset(__s,0,uVar20 * 8);
    }
    uVar15 = (long)iVar3 / (long)(int)(uVar21 - iVar4);
    uVar9 = (uint)uVar15;
    if ((uVar9 < uVar1) && (0 < iVar3)) {
      if (0 < (int)uVar21) {
        pwVar10 = pVVar5->pArray;
        pwVar12 = __s + (uVar15 & 0xffffffff);
        piVar7 = pVVar6->pArray;
        uVar15 = 0;
        do {
          iVar3 = piVar7[uVar15];
          if ((iVar3 < 0) || ((int)uVar2 <= iVar3)) goto LAB_006347a6;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          if (uVar1 <= iVar3 * uVar9) goto LAB_00634787;
          if (pwVar12 != __s + iVar3 * uVar9) {
            __assert_fail("pSim == Gia_ObjSimObj( p, pObj )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssc/sscSim.c"
                          ,0x105,"void Ssc_GiaSimRound(Gia_Man_t *)");
          }
          if (0 < iVar11) {
            uVar16 = 0;
            do {
              pwVar12[uVar16] = pwVar10[uVar16];
              uVar16 = uVar16 + 1;
            } while (uVar20 != uVar16);
          }
          pwVar12 = pwVar12 + iVar11;
          uVar15 = uVar15 + 1;
          pwVar10 = pwVar10 + iVar11;
        } while (uVar15 != uVar21);
      }
      uVar21 = (uVar21 + 1) * uVar9;
      if (uVar21 < uVar1) {
        if ((0 < (int)uVar2) && (pGVar8 = p->pObjs, pGVar8 != (Gia_Obj_t *)0x0)) {
          pwVar12 = __s + uVar21;
          uVar15 = 0;
          do {
            uVar16 = *(ulong *)(pGVar8 + uVar15);
            uVar21 = (uint)uVar16;
            if ((~uVar21 & 0x1fffffff) != 0 && -1 < (int)uVar21) {
              if (uVar1 <= (uint)(uVar15 * (long)(int)uVar9)) goto LAB_00634787;
              if (pwVar12 != __s + uVar15 * (long)(int)uVar9) {
                __assert_fail("pSim == Gia_ObjSim( p, i )",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssc/sscSim.c"
                              ,0x10e,"void Ssc_GiaSimRound(Gia_Man_t *)");
              }
              lVar17 = (long)(int)((uVar21 & 0x1fffffff) * iVar11);
              lVar19 = (long)(int)(((uint)(uVar16 >> 0x20) & 0x1fffffff) * iVar11);
              if ((uVar16 >> 0x3d & 1) == 0 || (uVar21 >> 0x1d & 1) == 0) {
                if ((uVar21 >> 0x1d & 1) == 0) {
                  if ((uVar16 >> 0x3d & 1) == 0) {
                    pwVar10 = pwVar12;
                    uVar16 = uVar20;
                    if (0 < iVar11) {
                      do {
                        *pwVar10 = pwVar10[-lVar19] & pwVar10[-lVar17];
                        uVar16 = uVar16 - 1;
                        pwVar10 = pwVar10 + 1;
                      } while (uVar16 != 0);
                    }
                  }
                  else {
                    pwVar10 = pwVar12;
                    uVar16 = uVar20;
                    if (0 < iVar11) {
                      do {
                        *pwVar10 = ~pwVar10[-lVar19] & pwVar10[-lVar17];
                        uVar16 = uVar16 - 1;
                        pwVar10 = pwVar10 + 1;
                      } while (uVar16 != 0);
                    }
                  }
                }
                else {
                  pwVar10 = pwVar12;
                  uVar16 = uVar20;
                  if (0 < iVar11) {
                    do {
                      *pwVar10 = ~pwVar10[-lVar17] & pwVar10[-lVar19];
                      uVar16 = uVar16 - 1;
                      pwVar10 = pwVar10 + 1;
                    } while (uVar16 != 0);
                  }
                }
              }
              else {
                pwVar10 = pwVar12;
                uVar16 = uVar20;
                if (0 < iVar11) {
                  do {
                    *pwVar10 = ~(pwVar10[-lVar19] | pwVar10[-lVar17]);
                    uVar16 = uVar16 - 1;
                    pwVar10 = pwVar10 + 1;
                  } while (uVar16 != 0);
                }
              }
              pwVar12 = pwVar12 + iVar11;
            }
            uVar15 = uVar15 + 1;
          } while (uVar15 != uVar2);
        }
        pVVar6 = p->vCos;
        uVar21 = pVVar6->nSize;
        uVar14 = uVar21 - iVar4;
        uVar13 = (uVar2 - uVar14) * uVar9;
        if (uVar13 < uVar1) {
          if (0 < (int)uVar14) {
            pwVar12 = __s + uVar13;
            uVar16 = 0;
            uVar15 = (ulong)uVar21;
            if ((int)uVar21 < 1) {
              uVar15 = uVar16;
            }
            do {
              if (uVar16 == uVar15) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              iVar3 = pVVar6->pArray[uVar16];
              if (((long)iVar3 < 0) || ((int)uVar2 <= iVar3)) {
LAB_006347a6:
                __assert_fail("v >= 0 && v < p->nObjs",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                              ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
              }
              if (p->pObjs == (Gia_Obj_t *)0x0) {
                return;
              }
              if (uVar1 <= iVar3 * uVar9) goto LAB_00634787;
              if (pwVar12 != __s + iVar3 * uVar9) {
                __assert_fail("pSim == Gia_ObjSimObj( p, pObj )",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssc/sscSim.c"
                              ,0x118,"void Ssc_GiaSimRound(Gia_Man_t *)");
              }
              uVar21 = *(uint *)(p->pObjs + iVar3);
              lVar17 = (long)(int)((uVar21 & 0x1fffffff) * iVar11);
              if ((uVar21 >> 0x1d & 1) == 0) {
                if (0 < iVar11) {
                  uVar18 = 0;
                  do {
                    pwVar12[uVar18] = pwVar12[uVar18 - lVar17];
                    uVar18 = uVar18 + 1;
                  } while (uVar20 != uVar18);
                }
              }
              else if (0 < iVar11) {
                uVar18 = 0;
                do {
                  pwVar12[uVar18] = ~pwVar12[uVar18 - lVar17];
                  uVar18 = uVar18 + 1;
                } while (uVar20 != uVar18);
              }
              pwVar12 = pwVar12 + iVar11;
              uVar16 = uVar16 + 1;
            } while (uVar16 != uVar14);
          }
          return;
        }
      }
    }
  }
LAB_00634787:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
}

Assistant:

void Ssc_GiaSimRound( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    word * pSim, * pSim0, * pSim1;
    int i, nWords = Gia_ObjSimWords(p);
    Ssc_GiaResetSimInfo( p );
    assert( nWords == Vec_WrdSize(p->vSims) / Gia_ManObjNum(p) );
    // constant node
    Ssc_SimConst( Gia_ObjSim(p, 0), nWords, 0 );
    // primary inputs
    pSim = Gia_ObjSim( p, 1 );
    pSim0 = Gia_ObjSimPi( p, 0 );
    Gia_ManForEachCi( p, pObj, i )
    {
        assert( pSim == Gia_ObjSimObj( p, pObj ) );
        Ssc_SimDup( pSim, pSim0, nWords, 0 );
        pSim += nWords;
        pSim0 += nWords;
    }
    // intermediate nodes
    pSim = Gia_ObjSim( p, 1+Gia_ManCiNum(p) );
    Gia_ManForEachAnd( p, pObj, i )
    {
        assert( pSim == Gia_ObjSim( p, i ) );
        pSim0 = pSim - pObj->iDiff0 * nWords;
        pSim1 = pSim - pObj->iDiff1 * nWords;
        Ssc_SimAnd( pSim, pSim0, pSim1, nWords, Gia_ObjFaninC0(pObj), Gia_ObjFaninC1(pObj) );
        pSim += nWords;
    }
    // primary outputs
    pSim = Gia_ObjSim( p, Gia_ManObjNum(p) - Gia_ManPoNum(p) );
    Gia_ManForEachPo( p, pObj, i )
    {
        assert( pSim == Gia_ObjSimObj( p, pObj ) );
        pSim0 = pSim - pObj->iDiff0 * nWords;
        Ssc_SimDup( pSim, pSim0, nWords, Gia_ObjFaninC0(pObj) );
//        Extra_PrintBinary( stdout, pSim, 64 ), printf( "\n" );
        pSim += nWords;
    }
}